

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_point.cpp
# Opt level: O3

ON_3fVector * ON_3fVector::UnitVector(int index)

{
  int iVar1;
  ON_3fVector *pOVar2;
  
  if (UnitVector(int)::o == '\0') {
    iVar1 = __cxa_guard_acquire(&UnitVector(int)::o);
    if (iVar1 != 0) {
      ON_3fVector(&UnitVector::o,0.0,0.0,0.0);
      __cxa_guard_release(&UnitVector(int)::o);
    }
  }
  if (UnitVector(int)::x == '\0') {
    iVar1 = __cxa_guard_acquire(&UnitVector(int)::x);
    if (iVar1 != 0) {
      ON_3fVector(&UnitVector::x,1.0,0.0,0.0);
      __cxa_guard_release(&UnitVector(int)::x);
    }
  }
  if (UnitVector(int)::y == '\0') {
    iVar1 = __cxa_guard_acquire(&UnitVector(int)::y);
    if (iVar1 != 0) {
      ON_3fVector(&UnitVector::y,0.0,1.0,0.0);
      __cxa_guard_release(&UnitVector(int)::y);
    }
  }
  if (UnitVector(int)::z == '\0') {
    iVar1 = __cxa_guard_acquire(&UnitVector(int)::z);
    if (iVar1 != 0) {
      ON_3fVector(&UnitVector::z,0.0,0.0,1.0);
      __cxa_guard_release(&UnitVector(int)::z);
    }
  }
  if ((uint)index < 3) {
    pOVar2 = (ON_3fVector *)(&PTR_x_008176a0)[(uint)index];
  }
  else {
    pOVar2 = &UnitVector::o;
  }
  return pOVar2;
}

Assistant:

const ON_3fVector& ON_3fVector::UnitVector(int index)
{
  static ON_3fVector o(0.0,0.0,0.0);
  static ON_3fVector x(1.0,0.0,0.0);
  static ON_3fVector y(0.0,1.0,0.0);
  static ON_3fVector z(0.0,0.0,1.0);
  switch(index)
  {
  case 0:
    return x;
  case 1:
    return y;
  case 2:
    return z;
  }
  return o;
}